

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_loopfilter_sse2.c
# Opt level: O0

void aom_highbd_lpf_vertical_4_dual_sse2
               (uint16_t *s,int p,uint8_t *blimit0,uint8_t *limit0,uint8_t *thresh0,uint8_t *blimit1
               ,uint8_t *limit1,uint8_t *thresh1,int bd)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  uint8_t *in_RCX;
  uint8_t *in_RDX;
  int in_ESI;
  long in_RDI;
  uint8_t *in_R8;
  uint8_t *in_R9;
  ulong uVar32;
  undefined1 auVar33 [16];
  ulong uVar34;
  uint8_t *in_stack_00000008;
  uint8_t *in_stack_00000010;
  int in_stack_00000018;
  __m128i qs [2];
  __m128i ps [2];
  __m128i d7;
  __m128i d6;
  __m128i d5;
  __m128i d4;
  __m128i d3;
  __m128i d2;
  __m128i d1;
  __m128i d0;
  __m128i x7;
  __m128i x6;
  __m128i x5;
  __m128i x4;
  __m128i x3;
  __m128i x2;
  __m128i x1;
  __m128i x0;
  __m128i t80;
  __m128i one;
  __m128i ffff;
  __m128i abs_q1q0;
  __m128i abs_p1p0;
  __m128i abs_p1q1;
  __m128i abs_p0q0;
  __m128i zero;
  __m128i q [2];
  __m128i p_1 [2];
  __m128i flat;
  __m128i mask;
  __m128i thresh0_1;
  __m128i limit0_1;
  __m128i blimit0_1;
  __m128i *t80_out;
  __m128i *thr_out;
  __m128i *d2_00;
  __m128i *d3_00;
  __m128i *d4_00;
  __m128i *d5_00;
  __m128i *d6_00;
  __m128i *in_stack_fffffffffffff728;
  longlong local_8b8 [3];
  __m128i *in_stack_fffffffffffff760;
  __m128i *in_stack_fffffffffffff768;
  __m128i *in_stack_fffffffffffff770;
  __m128i *in_stack_fffffffffffff778;
  __m128i *in_stack_fffffffffffff780;
  __m128i *in_stack_fffffffffffff788;
  longlong local_868 [2];
  longlong local_858;
  longlong lStack_850;
  longlong local_848 [2];
  longlong local_838;
  longlong lStack_830;
  longlong local_828;
  longlong lStack_820;
  longlong local_818 [3];
  undefined8 uStack_800;
  longlong local_7f8 [3];
  undefined8 uStack_7e0;
  longlong local_7d8 [3];
  undefined8 uStack_7c0;
  longlong local_7b8 [3];
  undefined8 uStack_7a0;
  uint8_t *local_798;
  uint8_t *local_790;
  uint8_t *local_788;
  uint8_t *local_780;
  int local_774;
  long local_770;
  longlong local_768;
  undefined8 uStack_760;
  longlong *local_750;
  undefined8 local_748;
  undefined8 uStack_740;
  undefined8 *local_730;
  longlong local_728;
  undefined8 uStack_720;
  longlong *local_710;
  undefined8 local_708;
  undefined8 uStack_700;
  undefined8 *local_6f0;
  longlong local_6e8;
  undefined8 uStack_6e0;
  longlong *local_6d0;
  undefined8 local_6c8;
  undefined8 uStack_6c0;
  undefined8 *local_6b0;
  longlong local_6a8;
  undefined8 uStack_6a0;
  longlong *local_690;
  undefined8 local_688;
  undefined8 uStack_680;
  undefined8 *local_670;
  longlong local_568 [2];
  undefined8 local_558;
  undefined8 uStack_550;
  undefined2 local_548;
  undefined2 uStack_546;
  undefined2 uStack_544;
  undefined2 uStack_542;
  undefined2 uStack_540;
  undefined2 uStack_53e;
  undefined2 uStack_53c;
  undefined2 uStack_53a;
  ulong local_538;
  ulong uStack_530;
  ulong local_528;
  ulong uStack_520;
  undefined8 local_518;
  undefined8 uStack_510;
  undefined1 local_508 [16];
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  longlong local_4e8;
  longlong lStack_4e0;
  longlong local_4d8;
  longlong lStack_4d0;
  longlong local_4c8;
  longlong lStack_4c0;
  longlong local_4b8;
  longlong lStack_4b0;
  ushort local_4a8;
  ushort uStack_4a6;
  ushort uStack_4a4;
  ushort uStack_4a2;
  ushort uStack_4a0;
  ushort uStack_49e;
  ushort uStack_49c;
  ushort uStack_49a;
  undefined8 local_498;
  undefined8 uStack_490;
  longlong local_488 [2];
  longlong local_478;
  longlong lStack_470;
  longlong local_468;
  longlong lStack_460;
  uint8_t *local_438;
  uint8_t *local_430;
  uint8_t *local_428;
  uint8_t *local_420;
  __m128i *local_418;
  __m128i *local_410;
  __m128i *local_408;
  __m128i *local_400;
  __m128i *local_3f8;
  __m128i *local_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined1 local_3d8 [16];
  ulong local_3c8;
  ulong uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  ulong local_378;
  ulong uStack_370;
  ulong local_368;
  ulong uStack_360;
  undefined2 local_34e;
  undefined4 local_34c;
  undefined8 local_348;
  undefined8 uStack_340;
  longlong local_338;
  longlong lStack_330;
  undefined1 local_318 [16];
  undefined1 local_308 [16];
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  longlong local_268;
  longlong lStack_260;
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  undefined8 local_238;
  undefined8 uStack_230;
  longlong local_228;
  longlong lStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  ulong local_1f8;
  ulong uStack_1f0;
  ulong local_1e8;
  ulong uStack_1e0;
  longlong local_1d8;
  longlong lStack_1d0;
  longlong local_1a8;
  longlong lStack_1a0;
  longlong local_108;
  longlong lStack_100;
  longlong local_f8;
  longlong lStack_f0;
  longlong local_d8;
  longlong lStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  longlong local_b8;
  longlong lStack_b0;
  undefined1 local_a8 [16];
  ulong local_98;
  ulong uStack_90;
  short local_88;
  short sStack_86;
  short sStack_84;
  short sStack_82;
  short sStack_80;
  short sStack_7e;
  short sStack_7c;
  short sStack_7a;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined2 local_20;
  undefined2 local_1e;
  undefined2 local_1c;
  undefined2 local_1a;
  undefined2 local_18;
  undefined2 local_16;
  undefined2 local_14;
  undefined2 local_12;
  
  local_670 = (undefined8 *)(in_RDI + -4);
  local_7b8[2] = *local_670;
  uStack_680 = 0;
  uStack_7a0 = 0;
  local_690 = (longlong *)(in_RDI + -4 + (long)in_ESI * 2);
  local_7b8[0] = *local_690;
  uStack_6a0 = 0;
  local_7b8[1] = 0;
  local_6b0 = (undefined8 *)(in_RDI + -4 + (long)(in_ESI * 2) * 2);
  local_7d8[2] = *local_6b0;
  uStack_6c0 = 0;
  uStack_7c0 = 0;
  local_6d0 = (longlong *)(in_RDI + -4 + (long)(in_ESI * 3) * 2);
  local_7d8[0] = *local_6d0;
  uStack_6e0 = 0;
  local_7d8[1] = 0;
  local_6f0 = (undefined8 *)(in_RDI + -4 + (long)(in_ESI << 2) * 2);
  local_7f8[2] = *local_6f0;
  uStack_700 = 0;
  uStack_7e0 = 0;
  local_710 = (longlong *)(in_RDI + -4 + (long)(in_ESI * 5) * 2);
  local_7f8[0] = *local_710;
  uStack_720 = 0;
  local_7f8[1] = 0;
  local_730 = (undefined8 *)(in_RDI + -4 + (long)(in_ESI * 6) * 2);
  local_818[2] = *local_730;
  uStack_740 = 0;
  uStack_800 = 0;
  local_750 = (longlong *)(in_RDI + -4 + (long)(in_ESI * 7) * 2);
  local_818[0] = *local_750;
  uStack_760 = 0;
  local_818[1] = 0;
  d2_00 = &local_848;
  d5_00 = (__m128i *)&local_828;
  d6_00 = (__m128i *)&local_838;
  local_798 = in_R9;
  local_790 = in_R8;
  local_788 = in_RCX;
  local_780 = in_RDX;
  local_774 = in_ESI;
  local_770 = in_RDI;
  local_768 = local_818[0];
  local_748 = local_818[2];
  local_728 = local_7f8[0];
  local_708 = local_7f8[2];
  local_6e8 = local_7d8[0];
  local_6c8 = local_7d8[2];
  local_6a8 = local_7b8[0];
  local_688 = local_7b8[2];
  highbd_transpose8x8_low_sse2
            ((__m128i *)(local_7b8 + 2),(__m128i *)local_7b8,(__m128i *)(local_7d8 + 2),
             (__m128i *)local_7d8,(__m128i *)(local_7f8 + 2),(__m128i *)local_7f8,
             (__m128i *)(local_818 + 2),(__m128i *)local_818,(__m128i *)&local_828,
             (__m128i *)&local_838,d2_00,(__m128i *)&local_858);
  d3_00 = (__m128i *)local_8b8;
  d4_00 = (__m128i *)&stack0xfffffffffffff728;
  local_420 = local_780;
  local_428 = local_788;
  local_430 = local_790;
  local_438 = local_798;
  local_3e8 = 0;
  uStack_3e0 = 0;
  local_4f8 = 0;
  uStack_4f0 = 0;
  local_268 = (*d2_00)[0];
  lStack_260 = (*d2_00)[1];
  auVar13._8_8_ = lStack_830;
  auVar13._0_8_ = local_838;
  auVar12._8_8_ = lStack_830;
  auVar12._0_8_ = local_838;
  local_248 = psubusw((undefined1  [16])*d2_00,auVar12);
  local_258 = psubusw(auVar13,(undefined1  [16])*d2_00);
  local_508._0_8_ = local_248._0_8_ | local_258._0_8_;
  local_508._8_8_ = local_248._8_8_ | local_258._8_8_;
  auVar9._8_8_ = lStack_850;
  auVar9._0_8_ = local_858;
  auVar8._8_8_ = lStack_850;
  auVar8._0_8_ = local_858;
  auVar17._8_8_ = lStack_820;
  auVar17._0_8_ = local_828;
  auVar16._8_8_ = lStack_820;
  auVar16._0_8_ = local_828;
  local_288 = psubusw(auVar8,auVar16);
  local_298 = psubusw(auVar17,auVar9);
  local_518 = local_288._0_8_ | local_298._0_8_;
  uStack_510 = local_288._8_8_ | local_298._8_8_;
  auVar19._8_8_ = lStack_820;
  auVar19._0_8_ = local_828;
  auVar18._8_8_ = lStack_820;
  auVar18._0_8_ = local_828;
  auVar15._8_8_ = lStack_830;
  auVar15._0_8_ = local_838;
  auVar14._8_8_ = lStack_830;
  auVar14._0_8_ = local_838;
  local_2c8 = psubusw(auVar18,auVar14);
  local_2d8 = psubusw(auVar15,auVar19);
  local_528 = local_2c8._0_8_ | local_2d8._0_8_;
  uStack_520 = local_2c8._8_8_ | local_2d8._8_8_;
  auVar11._8_8_ = lStack_850;
  auVar11._0_8_ = local_858;
  auVar10._8_8_ = lStack_850;
  auVar10._0_8_ = local_858;
  local_338 = (*d2_00)[0];
  lStack_330 = (*d2_00)[1];
  local_308 = psubusw(auVar10,(undefined1  [16])*d2_00);
  local_318 = psubusw((undefined1  [16])*d2_00,auVar11);
  local_538 = local_308._0_8_ | local_318._0_8_;
  uStack_530 = local_308._8_8_ | local_318._8_8_;
  local_548 = 0xffff;
  uStack_546 = 0xffff;
  uStack_544 = 0xffff;
  uStack_542 = 0xffff;
  uStack_540 = 0xffff;
  uStack_53e = 0xffff;
  uStack_53c = 0xffff;
  uStack_53a = 0xffff;
  local_34e = 1;
  local_12 = 1;
  local_14 = 1;
  local_16 = 1;
  local_18 = 1;
  local_1a = 1;
  local_1c = 1;
  local_1e = 1;
  local_20 = 1;
  local_558 = 0x1000100010001;
  uStack_550 = 0x1000100010001;
  t80_out = &local_568;
  thr_out = &local_488;
  local_418 = d4_00;
  local_410 = d3_00;
  local_408 = (__m128i *)&local_858;
  local_400 = d2_00;
  local_3f8 = (__m128i *)&local_838;
  local_3f0 = (__m128i *)&local_828;
  local_378 = local_528;
  uStack_370 = uStack_520;
  local_368 = local_528;
  uStack_360 = uStack_520;
  local_1d8 = local_268;
  lStack_1d0 = lStack_260;
  local_1a8 = local_268;
  lStack_1a0 = lStack_260;
  local_108 = local_338;
  lStack_100 = lStack_330;
  local_f8 = local_338;
  lStack_f0 = lStack_330;
  local_38 = local_558;
  uStack_30 = uStack_550;
  get_limit_dual(local_780,local_788,local_790,local_798,in_stack_00000008,in_stack_00000010,
                 in_stack_00000018,(__m128i *)&local_468,(__m128i *)&local_478,thr_out,t80_out);
  local_48 = local_528;
  uVar30 = local_48;
  uStack_40 = uStack_520;
  uVar31 = uStack_40;
  local_58 = local_538;
  uVar28 = local_58;
  uStack_50 = uStack_530;
  uVar29 = uStack_50;
  local_48._0_2_ = (short)local_528;
  local_48._2_2_ = (short)(local_528 >> 0x10);
  local_48._4_2_ = (short)(local_528 >> 0x20);
  local_48._6_2_ = (short)(local_528 >> 0x30);
  uStack_40._0_2_ = (short)uStack_520;
  uStack_40._2_2_ = (short)(uStack_520 >> 0x10);
  uStack_40._4_2_ = (short)(uStack_520 >> 0x20);
  uStack_40._6_2_ = (short)(uStack_520 >> 0x30);
  local_58._0_2_ = (short)local_538;
  local_58._2_2_ = (short)(local_538 >> 0x10);
  local_58._4_2_ = (short)(local_538 >> 0x20);
  local_58._6_2_ = (short)(local_538 >> 0x30);
  uStack_50._0_2_ = (short)uStack_530;
  uStack_50._2_2_ = (short)(uStack_530 >> 0x10);
  uStack_50._4_2_ = (short)(uStack_530 >> 0x20);
  uStack_50._6_2_ = (short)(uStack_530 >> 0x30);
  local_4a8 = (ushort)((short)local_48 < (short)local_58) * (short)local_58 |
              (ushort)((short)local_48 >= (short)local_58) * (short)local_48;
  uStack_4a6 = (ushort)(local_48._2_2_ < local_58._2_2_) * local_58._2_2_ |
               (ushort)(local_48._2_2_ >= local_58._2_2_) * local_48._2_2_;
  uStack_4a4 = (ushort)(local_48._4_2_ < local_58._4_2_) * local_58._4_2_ |
               (ushort)(local_48._4_2_ >= local_58._4_2_) * local_48._4_2_;
  uStack_4a2 = (ushort)(local_48._6_2_ < local_58._6_2_) * local_58._6_2_ |
               (ushort)(local_48._6_2_ >= local_58._6_2_) * local_48._6_2_;
  uStack_4a0 = (ushort)((short)uStack_40 < (short)uStack_50) * (short)uStack_50 |
               (ushort)((short)uStack_40 >= (short)uStack_50) * (short)uStack_40;
  uStack_49e = (ushort)(uStack_40._2_2_ < uStack_50._2_2_) * uStack_50._2_2_ |
               (ushort)(uStack_40._2_2_ >= uStack_50._2_2_) * uStack_40._2_2_;
  uStack_49c = (ushort)(uStack_40._4_2_ < uStack_50._4_2_) * uStack_50._4_2_ |
               (ushort)(uStack_40._4_2_ >= uStack_50._4_2_) * uStack_40._4_2_;
  uStack_49a = (ushort)(uStack_40._6_2_ < uStack_50._6_2_) * uStack_50._6_2_ |
               (ushort)(uStack_40._6_2_ >= uStack_50._6_2_) * uStack_40._6_2_;
  local_1e8 = local_508._0_8_;
  uStack_1e0 = local_508._8_8_;
  local_1f8 = local_508._0_8_;
  uStack_1f0 = local_508._8_8_;
  auVar4._8_8_ = local_508._8_8_;
  auVar4._0_8_ = local_508._0_8_;
  auVar3._8_8_ = local_508._8_8_;
  auVar3._0_8_ = local_508._0_8_;
  local_508 = paddusw(auVar4,auVar3);
  local_348 = local_518;
  uVar26 = local_348;
  uStack_340 = uStack_510;
  uVar27 = uStack_340;
  local_34c = 1;
  local_348._0_2_ = (ushort)local_518;
  local_348._2_2_ = (ushort)(local_518 >> 0x10);
  local_348._4_2_ = (ushort)(local_518 >> 0x20);
  uStack_340._0_2_ = (ushort)uStack_510;
  uStack_340._2_2_ = (ushort)(uStack_510 >> 0x10);
  uStack_340._4_2_ = (ushort)(uStack_510 >> 0x20);
  uVar32 = local_518 >> 0x31;
  uVar34 = uStack_510 >> 0x31;
  local_518 = CONCAT26((ushort)uVar32,
                       CONCAT24(local_348._4_2_ >> 1,
                                CONCAT22(local_348._2_2_ >> 1,(ushort)local_348 >> 1)));
  uStack_510 = CONCAT26((ushort)uVar34,
                        CONCAT24(uStack_340._4_2_ >> 1,
                                 CONCAT22(uStack_340._2_2_ >> 1,(ushort)uStack_340 >> 1)));
  local_208 = local_508._0_8_;
  uStack_200 = local_508._8_8_;
  local_218 = local_518;
  uStack_210 = uStack_510;
  auVar2._8_8_ = uStack_510;
  auVar2._0_8_ = local_518;
  local_a8 = paddusw(local_508,auVar2);
  local_b8 = local_468;
  lStack_b0 = lStack_460;
  auVar7._8_8_ = lStack_460;
  auVar7._0_8_ = local_468;
  auVar33 = psubusw(local_a8,auVar7);
  local_498 = auVar33._0_8_;
  uStack_490 = auVar33._8_8_;
  local_388 = local_498;
  uVar24 = local_388;
  uStack_380 = uStack_490;
  uVar25 = uStack_380;
  local_398 = local_4f8;
  uVar22 = local_398;
  uStack_390 = uStack_4f0;
  uVar23 = uStack_390;
  local_388._0_2_ = auVar33._0_2_;
  local_388._2_2_ = auVar33._2_2_;
  local_388._4_2_ = auVar33._4_2_;
  local_388._6_2_ = auVar33._6_2_;
  uStack_380._0_2_ = auVar33._8_2_;
  uStack_380._2_2_ = auVar33._10_2_;
  uStack_380._4_2_ = auVar33._12_2_;
  uStack_380._6_2_ = auVar33._14_2_;
  local_398._0_2_ = (short)local_4f8;
  local_398._2_2_ = (short)((ulong)local_4f8 >> 0x10);
  local_398._4_2_ = (short)((ulong)local_4f8 >> 0x20);
  local_398._6_2_ = (short)((ulong)local_4f8 >> 0x30);
  uStack_390._0_2_ = (short)uStack_4f0;
  uStack_390._2_2_ = (short)((ulong)uStack_4f0 >> 0x10);
  uStack_390._4_2_ = (short)((ulong)uStack_4f0 >> 0x20);
  uStack_390._6_2_ = (short)((ulong)uStack_4f0 >> 0x30);
  local_88 = -(ushort)((short)local_388 == (short)local_398);
  sStack_86 = -(ushort)(local_388._2_2_ == local_398._2_2_);
  sStack_84 = -(ushort)(local_388._4_2_ == local_398._4_2_);
  sStack_82 = -(ushort)(local_388._6_2_ == local_398._6_2_);
  sStack_80 = -(ushort)((short)uStack_380 == (short)uStack_390);
  sStack_7e = -(ushort)(uStack_380._2_2_ == uStack_390._2_2_);
  sStack_7c = -(ushort)(uStack_380._4_2_ == uStack_390._4_2_);
  sStack_7a = -(ushort)(uStack_380._6_2_ == uStack_390._6_2_);
  local_98 = CONCAT26(uStack_542,CONCAT24(uStack_544,CONCAT22(uStack_546,local_548)));
  uStack_90 = CONCAT26(uStack_53a,CONCAT24(uStack_53c,CONCAT22(uStack_53e,uStack_540)));
  local_3c8 = CONCAT26(sStack_82,CONCAT24(sStack_84,CONCAT22(sStack_86,local_88))) ^ local_98;
  uStack_3c0 = CONCAT26(sStack_7a,CONCAT24(sStack_7c,CONCAT22(sStack_7e,sStack_80))) ^ uStack_90;
  local_228 = local_478;
  lStack_220 = lStack_470;
  local_238 = local_558;
  uStack_230 = uStack_550;
  auVar1._8_8_ = lStack_470;
  auVar1._0_8_ = local_478;
  auVar33._8_8_ = uStack_550;
  auVar33._0_8_ = local_558;
  local_3d8 = paddusw(auVar1,auVar33);
  uVar32 = local_3c8 & local_3d8._0_8_;
  uVar34 = uStack_3c0 & local_3d8._8_8_;
  local_68 = CONCAT26(uStack_4a2,CONCAT24(uStack_4a4,CONCAT22(uStack_4a6,local_4a8)));
  uStack_60 = CONCAT26(uStack_49a,CONCAT24(uStack_49c,CONCAT22(uStack_49e,uStack_4a0)));
  local_78._0_2_ = (short)uVar32;
  local_78._2_2_ = (short)(uVar32 >> 0x10);
  local_78._4_2_ = (short)(uVar32 >> 0x20);
  local_78._6_2_ = (short)(uVar32 >> 0x30);
  uStack_70._0_2_ = (short)uVar34;
  uStack_70._2_2_ = (short)(uVar34 >> 0x10);
  uStack_70._4_2_ = (short)(uVar34 >> 0x20);
  uStack_70._6_2_ = (short)(uVar34 >> 0x30);
  local_498._0_4_ =
       CONCAT22((ushort)((short)uStack_4a6 < local_78._2_2_) * local_78._2_2_ |
                ((short)uStack_4a6 >= local_78._2_2_) * uStack_4a6,
                (ushort)((short)local_4a8 < (short)local_78) * (short)local_78 |
                ((short)local_4a8 >= (short)local_78) * local_4a8);
  local_498._0_6_ =
       CONCAT24((ushort)((short)uStack_4a4 < local_78._4_2_) * local_78._4_2_ |
                ((short)uStack_4a4 >= local_78._4_2_) * uStack_4a4,(undefined4)local_498);
  local_498 = CONCAT26((ushort)((short)uStack_4a2 < local_78._6_2_) * local_78._6_2_ |
                       ((short)uStack_4a2 >= local_78._6_2_) * uStack_4a2,(undefined6)local_498);
  uStack_490._0_2_ =
       (ushort)((short)uStack_4a0 < (short)uStack_70) * (short)uStack_70 |
       ((short)uStack_4a0 >= (short)uStack_70) * uStack_4a0;
  uStack_490._2_2_ =
       (ushort)((short)uStack_49e < uStack_70._2_2_) * uStack_70._2_2_ |
       ((short)uStack_49e >= uStack_70._2_2_) * uStack_49e;
  uStack_490._4_2_ =
       (ushort)((short)uStack_49c < uStack_70._4_2_) * uStack_70._4_2_ |
       ((short)uStack_49c >= uStack_70._4_2_) * uStack_49c;
  uStack_490._6_2_ =
       (ushort)((short)uStack_49a < uStack_70._6_2_) * uStack_70._6_2_ |
       ((short)uStack_49a >= uStack_70._6_2_) * uStack_49a;
  local_c8 = local_498;
  uStack_c0 = uStack_490;
  local_d8 = local_478;
  lStack_d0 = lStack_470;
  auVar6._8_8_ = uStack_490;
  auVar6._0_8_ = local_498;
  auVar5._8_8_ = lStack_470;
  auVar5._0_8_ = local_478;
  auVar33 = psubusw(auVar6,auVar5);
  local_498 = auVar33._0_8_;
  uStack_490 = auVar33._8_8_;
  local_3a8 = local_498;
  uVar20 = local_3a8;
  uStack_3a0 = uStack_490;
  uVar21 = uStack_3a0;
  local_3b8 = local_4f8;
  uStack_3b0 = uStack_4f0;
  local_3a8._0_2_ = auVar33._0_2_;
  local_3a8._2_2_ = auVar33._2_2_;
  local_3a8._4_2_ = auVar33._4_2_;
  local_3a8._6_2_ = auVar33._6_2_;
  uStack_3a0._0_2_ = auVar33._8_2_;
  uStack_3a0._2_2_ = auVar33._10_2_;
  uStack_3a0._4_2_ = auVar33._12_2_;
  uStack_3a0._6_2_ = auVar33._14_2_;
  local_498._2_2_ = -(ushort)(local_3a8._2_2_ == local_398._2_2_);
  local_498._0_2_ = -(ushort)((short)local_3a8 == (short)local_398);
  local_498._4_2_ = -(ushort)(local_3a8._4_2_ == local_398._4_2_);
  local_498._6_2_ = -(ushort)(local_3a8._6_2_ == local_398._6_2_);
  uStack_490._0_2_ = -(ushort)((short)uStack_3a0 == (short)uStack_390);
  uStack_490._2_2_ = -(ushort)(uStack_3a0._2_2_ == uStack_390._2_2_);
  uStack_490._4_2_ = -(ushort)(uStack_3a0._4_2_ == uStack_390._4_2_);
  uStack_490._6_2_ = -(ushort)(uStack_3a0._6_2_ == uStack_390._6_2_);
  local_4c8 = (*local_3f8)[0];
  lStack_4c0 = (*local_3f8)[1];
  local_4b8 = (*local_3f0)[0];
  lStack_4b0 = (*local_3f0)[1];
  local_4e8 = (*local_400)[0];
  lStack_4e0 = (*local_400)[1];
  local_4d8 = (*local_408)[0];
  lStack_4d0 = (*local_408)[1];
  local_3a8 = uVar20;
  uStack_3a0 = uVar21;
  local_398 = uVar22;
  uStack_390 = uVar23;
  local_388 = uVar24;
  uStack_380 = uVar25;
  local_348 = uVar26;
  uStack_340 = uVar27;
  local_78 = uVar32;
  uStack_70 = uVar34;
  local_58 = uVar28;
  uStack_50 = uVar29;
  local_48 = uVar30;
  uStack_40 = uVar31;
  highbd_filter4_dual_sse2
            (in_stack_fffffffffffff788,in_stack_fffffffffffff780,in_stack_fffffffffffff778,
             in_stack_fffffffffffff770,in_stack_fffffffffffff768,in_stack_fffffffffffff760,
             (int)qs[1][0],(__m128i *)qs[1][1]);
  highbd_transpose4x8_8x4_sse2
            (thr_out,t80_out,(__m128i *)&stack0xfffffffffffff768,(__m128i *)&stack0xfffffffffffff778
             ,(__m128i *)&stack0xfffffffffffff788,&local_868,d2_00,d3_00,d4_00,d5_00,d6_00,
             in_stack_fffffffffffff728);
  *(longlong *)(local_770 + -4) = local_828;
  *(longlong *)(local_770 + -4 + (long)local_774 * 2) = local_838;
  *(longlong *)(local_770 + -4 + (long)(local_774 * 2) * 2) = local_848[0];
  *(longlong *)(local_770 + -4 + (long)(local_774 * 3) * 2) = local_858;
  *(longlong *)(local_770 + -4 + (long)(local_774 << 2) * 2) = local_868[0];
  *(__m128i **)(local_770 + -4 + (long)(local_774 * 5) * 2) = in_stack_fffffffffffff788;
  *(__m128i **)(local_770 + -4 + (long)(local_774 * 6) * 2) = in_stack_fffffffffffff778;
  *(__m128i **)(local_770 + -4 + (long)(local_774 * 7) * 2) = in_stack_fffffffffffff768;
  return;
}

Assistant:

void aom_highbd_lpf_vertical_4_dual_sse2(
    uint16_t *s, int p, const uint8_t *blimit0, const uint8_t *limit0,
    const uint8_t *thresh0, const uint8_t *blimit1, const uint8_t *limit1,
    const uint8_t *thresh1, int bd) {
  __m128i x0, x1, x2, x3, x4, x5, x6, x7;
  __m128i d0, d1, d2, d3, d4, d5, d6, d7;
  __m128i ps[2], qs[2];

  x0 = _mm_loadl_epi64((__m128i *)(s - 2 + 0 * p));
  x1 = _mm_loadl_epi64((__m128i *)(s - 2 + 1 * p));
  x2 = _mm_loadl_epi64((__m128i *)(s - 2 + 2 * p));
  x3 = _mm_loadl_epi64((__m128i *)(s - 2 + 3 * p));
  x4 = _mm_loadl_epi64((__m128i *)(s - 2 + 4 * p));
  x5 = _mm_loadl_epi64((__m128i *)(s - 2 + 5 * p));
  x6 = _mm_loadl_epi64((__m128i *)(s - 2 + 6 * p));
  x7 = _mm_loadl_epi64((__m128i *)(s - 2 + 7 * p));

  highbd_transpose8x8_low_sse2(&x0, &x1, &x2, &x3, &x4, &x5, &x6, &x7, &d0, &d1,
                               &d2, &d3);

  highbd_lpf_internal_4_dual_sse2(&d0, &d1, &d2, &d3, ps, qs, blimit0, limit0,
                                  thresh0, blimit1, limit1, thresh1, bd);

  highbd_transpose4x8_8x4_sse2(&ps[1], &ps[0], &qs[0], &qs[1], &d0, &d1, &d2,
                               &d3, &d4, &d5, &d6, &d7);

  _mm_storel_epi64((__m128i *)(s - 2 + 0 * p), d0);
  _mm_storel_epi64((__m128i *)(s - 2 + 1 * p), d1);
  _mm_storel_epi64((__m128i *)(s - 2 + 2 * p), d2);
  _mm_storel_epi64((__m128i *)(s - 2 + 3 * p), d3);
  _mm_storel_epi64((__m128i *)(s - 2 + 4 * p), d4);
  _mm_storel_epi64((__m128i *)(s - 2 + 5 * p), d5);
  _mm_storel_epi64((__m128i *)(s - 2 + 6 * p), d6);
  _mm_storel_epi64((__m128i *)(s - 2 + 7 * p), d7);
}